

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O2

entry * libtorrent::write_torrent_file
                  (entry *__return_storage_ptr__,add_torrent_params *atp,write_torrent_flags_t flags
                  )

{
  element_type *peVar1;
  pointer pvVar2;
  torrent_info *this;
  pointer pbVar3;
  __uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> _Var4;
  digest32<256L> *pdVar5;
  pointer ppVar6;
  undefined8 uVar7;
  pointer pdVar8;
  bool bVar9;
  int iVar10;
  int blocks_per_piece;
  entry *peVar11;
  vector<char,std::allocator<char>> *pvVar12;
  map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *this_00;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar13;
  int64_t iVar14;
  char *pcVar15;
  pointer pvVar16;
  mapped_type *this_01;
  string_type *psVar17;
  back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_> bVar18;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar19;
  ulong uVar20;
  char cVar21;
  file_index_t index;
  long lVar22;
  digest32<256L> *h;
  pointer pdVar23;
  merkle_tree *this_02;
  pointer verified;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  pointer pbVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pointer ppVar25;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  span<const_libtorrent::digest32<256L>_> t_00;
  span<const_libtorrent::digest32<256L>_> t_01;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  undefined1 local_160 [32];
  merkle_tree t;
  bitfield empty_verified;
  vector<sha256_hash> piece_layer;
  string_type local_d0;
  string_type local_b0;
  string_type local_90;
  string_type local_70;
  sha256_hash local_50;
  
  entry::entry(__return_storage_ptr__);
  peVar1 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    t.m_root._0_4_ = 4;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&t);
  }
  pcVar15 = (peVar1->m_info_section).px;
  iVar10 = peVar1->m_info_section_size;
  key._M_str = "info";
  key._M_len = 4;
  peVar11 = entry::operator[](__return_storage_ptr__,key);
  pvVar12 = (vector<char,std::allocator<char>> *)entry::preformatted(peVar11);
  ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
            (pvVar12,pcVar15,pcVar15 + iVar10);
  if ((atp->comment)._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_90,(string *)&atp->comment);
    key_00._M_str = "comment";
    key_00._M_len = 7;
    peVar11 = entry::operator[](__return_storage_ptr__,key_00);
    entry::operator=(peVar11,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  lVar22 = atp->creation_date;
  if (lVar22 != 0) {
    key_01._M_str = "creation date";
    key_01._M_len = 0xd;
    peVar11 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar11,lVar22);
  }
  if ((atp->created_by)._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_b0,(string *)&atp->created_by);
    key_02._M_str = "created by";
    key_02._M_len = 10;
    peVar11 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar11,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  pvVar16 = (atp->merkle_trees).
            super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            .
            super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (atp->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pvVar16 == pvVar2) {
    bVar9 = torrent_info::v2(this);
    if (bVar9 && (flags.m_val & 1) == 0) {
      t.m_root._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)&t);
    }
  }
  else {
    iVar10 = file_storage::num_files(&this->m_files);
    if (iVar10 != (int)(((long)pvVar2 - (long)pvVar16) / 0x18)) {
      t.m_root._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)&t);
    }
    key_03._M_str = "piece layers";
    key_03._M_len = 0xc;
    peVar11 = entry::operator[](__return_storage_ptr__,key_03);
    this_00 = (map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *
              )entry::dict_abi_cxx11_(peVar11);
    empty_verified.m_buf.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t
    .super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (unique_ptr<unsigned_int[],_long>)
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0;
    iVar13 = file_storage::file_range(&this->m_files);
    for (lVar22 = (long)iVar13._begin.m_val.m_val; lVar22 != (long)iVar13 >> 0x20;
        lVar22 = lVar22 + 1) {
      index.m_val = (int)lVar22;
      bVar9 = file_storage::pad_file_at(&this->m_files,index);
      if (!bVar9) {
        iVar14 = file_storage::file_size(&this->m_files,index);
        if ((this->m_files).m_piece_length < iVar14) {
          iVar10 = file_storage::file_num_blocks(&this->m_files,index);
          blocks_per_piece = file_storage::blocks_per_piece(&this->m_files);
          pcVar15 = file_storage::root_ptr(&this->m_files,index);
          aux::merkle_tree::merkle_tree(&t,iVar10,blocks_per_piece,pcVar15);
          pbVar3 = (atp->verified_leaf_hashes).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          verified = pbVar3 + lVar22;
          if ((int)((ulong)((long)(atp->verified_leaf_hashes).
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  .
                                  super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) >> 3)
              <= lVar22) {
            verified = &empty_verified;
          }
          pvVar16 = (atp->merkle_trees).
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    .
                    super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar22;
          pbVar3 = (atp->merkle_tree_mask).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (((lVar22 < (int)((ulong)((long)(atp->merkle_tree_mask).
                                             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             .
                                             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar3) >> 3)) &&
              (_Var4.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                    *(__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                     &pbVar3[lVar22].m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>,
              _Var4.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
              (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0)) &&
             (*(int *)_Var4.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
            pdVar5 = *(digest32<256L> **)
                      &(pvVar16->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_00.m_len = (long)*(pointer *)
                                ((long)&(pvVar16->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar5 >> 5;
            t_00.m_ptr = pdVar5;
            aux::merkle_tree::load_sparse_tree(&t,t_00,pbVar3 + lVar22,verified);
          }
          else {
            pdVar5 = *(digest32<256L> **)
                      &(pvVar16->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_01.m_len = (long)*(pointer *)
                                ((long)&(pvVar16->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar5 >> 5;
            t_01.m_ptr = pdVar5;
            aux::merkle_tree::load_tree(&t,t_01,verified);
          }
          aux::merkle_tree::get_piece_layer(&piece_layer,&t);
          pdVar23 = piece_layer.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pdVar8 = piece_layer.
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   .
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = file_storage::file_num_pieces(&this->m_files,index);
          if (iVar10 != (int)((ulong)((long)pdVar23 - (long)pdVar8) >> 5)) {
            local_160._0_4_ = torrent_invalid_piece_layer;
            aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)local_160);
          }
          aux::merkle_tree::root(&local_50,&t);
          digest32<256l>::to_string_abi_cxx11_((string *)local_160,&local_50);
          this_01 = boost::container::
                    map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>
                    ::priv_subscript<std::__cxx11::string>(this_00,(string *)local_160);
          psVar17 = entry::string_abi_cxx11_(this_01);
          ::std::__cxx11::string::~string((string *)local_160);
          pdVar8 = piece_layer.
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   .
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pdVar23 = piece_layer.
                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         .
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pdVar23 != pdVar8;
              pdVar23 = pdVar23 + 1) {
            digest32<256l>::to_string_abi_cxx11_((string *)local_160,pdVar23);
            ::std::__cxx11::string::append((string *)psVar17);
            ::std::__cxx11::string::~string((string *)local_160);
          }
          ::std::
          _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          ~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         *)&piece_layer);
          aux::merkle_tree::~merkle_tree(&t);
        }
      }
    }
    ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
              ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&empty_verified);
  }
  cVar21 = (char)((flags.m_val & 2) >> 1);
  if (cVar21 == '\0' &&
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_04._M_str = "url-list";
    key_04._M_len = 8;
    peVar11 = entry::operator[](__return_storage_ptr__,key_04);
    bVar18.container = entry::list(peVar11);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar18.container,
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar18);
  }
  if ((atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && cVar21 == '\0') {
    key_05._M_str = "httpseeds";
    key_05._M_len = 9;
    peVar11 = entry::operator[](__return_storage_ptr__,key_05);
    bVar18.container = entry::list(peVar11);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar18.container,
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar18);
  }
  if (((byte)((flags.m_val & 4) >> 2) &
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) == 1) {
    key_06._M_str = "nodes";
    key_06._M_len = 5;
    peVar11 = entry::operator[](__return_storage_ptr__,key_06);
    pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar11);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar19,
               ((long)(atp->dht_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->dht_nodes).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    ppVar6 = (atp->dht_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar25 = (atp->dht_nodes).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar6;
        ppVar25 = ppVar25 + 1) {
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&t,2,
                 (allocator_type *)local_160);
      ::std::__cxx11::string::string((string *)&local_70,(string *)ppVar25);
      entry::operator=((entry *)CONCAT44(t.m_root._4_4_,t.m_root._0_4_),&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      entry::operator=((entry *)(CONCAT44(t.m_root._4_4_,t.m_root._0_4_) + 0x28),
                       (long)ppVar25->second);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                (pvVar19,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&t);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&t);
    }
  }
  torrent_info::similar_torrents
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             local_160,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if ((pointer)CONCAT44(local_160._4_4_,local_160._0_4_) == (pointer)local_160._8_8_) {
LAB_00344877:
    ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)local_160);
  }
  else {
    torrent_info::info((bdecode_node *)&t,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"similar");
    bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&t);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&t);
    ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)local_160);
    if (!bVar9) {
      key_07._M_str = "similar";
      key_07._M_len = 7;
      peVar11 = entry::operator[](__return_storage_ptr__,key_07);
      pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar11);
      torrent_info::similar_torrents
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )&t,(atp->ti).
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar19,
                 ((long)t.m_tree.
                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        .
                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                 CONCAT44(t.m_root._4_4_,t.m_root._0_4_)) / 0x14);
      ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
      ::~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       *)&t);
      torrent_info::similar_torrents
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )local_160,
                 (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      uVar7 = local_160._8_8_;
      for (pbVar24 = (pointer)CONCAT44(local_160._4_4_,local_160._0_4_); pbVar24 != (pointer)uVar7;
          pbVar24 = (pointer)((pbVar24->field_2)._M_local_buf + 4)) {
        digest32<160l>::to_string_abi_cxx11_((string *)&t,pbVar24);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string>
                  (pvVar19,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
        ::std::__cxx11::string::~string((string *)&t);
      }
      goto LAB_00344877;
    }
  }
  torrent_info::collections_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_160,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if ((pointer)CONCAT44(local_160._4_4_,local_160._0_4_) == (pointer)local_160._8_8_) {
    this_02 = (merkle_tree *)local_160;
  }
  else {
    torrent_info::info((bdecode_node *)&t,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"collections");
    bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&t);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&t);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_160);
    if (bVar9) goto LAB_0034497a;
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    peVar11 = entry::operator[](__return_storage_ptr__,key_08);
    pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar11);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&t,(atp->ti).
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar19,
               (long)t.m_tree.
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               CONCAT44(t.m_root._4_4_,t.m_root._0_4_) >> 5);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&t);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&t,(atp->ti).
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    for (__args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(t.m_root._4_4_,t.m_root._0_4_);
        __args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  t.m_tree.
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args = __args + 1) {
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(pvVar19,__args);
    }
    this_02 = &t;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
LAB_0034497a:
  pbVar24 = (atp->trackers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar20 = (long)(atp->trackers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24;
  if (uVar20 == 0x20) {
    ::std::__cxx11::string::string((string *)&local_d0,(string *)pbVar24);
    key_09._M_str = "announce";
    key_09._M_len = 8;
    peVar11 = entry::operator[](__return_storage_ptr__,key_09);
    entry::operator=(peVar11,&local_d0);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  else if (0x20 < uVar20) {
    anon_unknown_24::build_tracker_list((entry *)&t,&atp->trackers,&atp->tracker_tiers);
    key_10._M_str = "announce-list";
    key_10._M_len = 0xd;
    peVar11 = entry::operator[](__return_storage_ptr__,key_10);
    entry::operator=(peVar11,(entry *)&t);
    entry::~entry((entry *)&t);
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_torrent_file(add_torrent_params const& atp, write_torrent_flags_t const flags)
	{
		entry ret;
		if (!atp.ti)
			aux::throw_ex<system_error>(errors::torrent_missing_info);

		auto const info = atp.ti->info_section();
		ret["info"].preformatted().assign(info.data(), info.data() + info.size());

		if (!atp.comment.empty())
			ret["comment"] = atp.comment;
		if (atp.creation_date != 0)
			ret["creation date"] = atp.creation_date;
		if (!atp.created_by.empty())
			ret["created by"] = atp.created_by;

		if (!atp.merkle_trees.empty())
		{
			file_storage const& fs = atp.ti->files();
			auto& trees = atp.merkle_trees;
			if (int(trees.size()) != fs.num_files())
				aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);

			auto& piece_layers = ret["piece layers"].dict();
			bitfield const empty_verified;
			for (file_index_t f : fs.file_range())
			{
				if (fs.pad_file_at(f) || fs.file_size(f) <= fs.piece_length())
					continue;

				aux::merkle_tree t(fs.file_num_blocks(f), fs.blocks_per_piece(), fs.root_ptr(f));

				bitfield const& verified = (f >= atp.verified_leaf_hashes.end_index())
					? empty_verified : atp.verified_leaf_hashes[f];

				auto const& tree = trees[f];
				if (f < atp.merkle_tree_mask.end_index() && !atp.merkle_tree_mask[f].empty())
				{
					t.load_sparse_tree(tree, atp.merkle_tree_mask[f], verified);
				}
				else
				{
					t.load_tree(tree, verified);
				}

				auto const piece_layer = t.get_piece_layer();
				if (int(piece_layer.size()) != fs.file_num_pieces(f))
					aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);

				auto& layer = piece_layers[t.root().to_string()].string();

				for (auto const& h : piece_layer)
					layer += h.to_string();
			}
		}
		else if (atp.ti->v2() && !(flags & write_flags::allow_missing_piece_layer))
		{
			// we must have piece layers for v2 torrents for them to be valid
			// .torrent files
			aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);
		}

		// save web seeds
		if (!atp.url_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& url_list = ret["url-list"].list();
			url_list.reserve(atp.url_seeds.size());
			std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));
		}

#if TORRENT_ABI_VERSION < 4
		if (!atp.http_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& httpseeds_list = ret["httpseeds"].list();
			httpseeds_list.reserve(atp.http_seeds.size());
			std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));
		}
#endif

		// save DHT nodes
		if (!atp.dht_nodes.empty() && (flags & write_flags::include_dht_nodes))
		{
			auto& nodes = ret["nodes"].list();
			nodes.reserve(atp.dht_nodes.size());
			for (auto const& n : atp.dht_nodes)
			{
				entry::list_type node(2);
				node[0] = std::move(n.first);
				node[1] = n.second;
				nodes.emplace_back(std::move(node));
			}
		}

		if (!atp.ti->similar_torrents().empty() && !atp.ti->info("similar"))
		{
			auto& l = ret["similar"].list();
			l.reserve(atp.ti->similar_torrents().size());
			for (auto const& n : atp.ti->similar_torrents())
				l.emplace_back(n.to_string());
		}

		if (!atp.ti->collections().empty() && !atp.ti->info("collections"))
		{
			auto& l = ret["collections"].list();
			l.reserve(atp.ti->collections().size());
			for (auto const& n : atp.ti->collections())
				l.emplace_back(n);
		}

		// save trackers
		if (atp.trackers.size() == 1)
			ret["announce"] = atp.trackers.front();
		else if (atp.trackers.size() > 1)
			ret["announce-list"] = build_tracker_list(atp.trackers, atp.tracker_tiers);

		return ret;
	}